

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::bt_peer_connection::write_piece
          (bt_peer_connection *this,peer_request *r,disk_buffer_holder *buffer)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pdVar4;
  pointer pdVar5;
  session_settings *psVar6;
  long *plVar7;
  peer_request *ppVar8;
  int val_1;
  list_type *this_00;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar9;
  _Base_ptr p_Var10;
  alert_manager *paVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar12;
  int iVar13;
  int iVar14;
  disk_buffer_holder *this_01;
  char cVar15;
  char *pcVar16;
  char *pcVar17;
  int *piVar18;
  element_type *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  bool bVar19;
  bool bVar20;
  span<const_char> buf;
  span<const_char> buf_00;
  span<const_char> buf_01;
  vector<char,_std::allocator<char>_> piece_list_buf;
  char msg [17];
  entry piece_list;
  map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  merkle_node_list;
  char *local_158;
  long lStack_150;
  long local_148;
  int *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  peer_request *local_110;
  size_type local_108;
  disk_buffer_holder *local_100;
  char local_f8 [32];
  undefined1 local_d8 [8];
  bool local_d0;
  undefined7 uStack_cf;
  _Rb_tree<int,_std::pair<const_int,_libtorrent::digest32<160L>_>,_std::_Select1st<std::pair<const_int,_libtorrent::digest32<160L>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
  local_a0;
  disk_buffer_holder local_70;
  disk_buffer_holder local_50;
  
  this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  this_03 = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar14 = p_Var2->_M_use_count;
      do {
        this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar14 == 0) break;
        LOCK();
        iVar13 = p_Var2->_M_use_count;
        bVar19 = iVar14 == iVar13;
        if (bVar19) {
          p_Var2->_M_use_count = iVar14 + 1;
          iVar13 = iVar14;
        }
        iVar14 = iVar13;
        UNLOCK();
        this_03 = p_Var2;
      } while (!bVar19);
    }
  }
  if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_02 = (torrent *)0x0;
  }
  else if (this_03->_M_use_count == 0) {
    this_02 = (torrent *)0x0;
  }
  local_100 = buffer;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar14 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar14 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar14 + -1;
    }
    if (iVar14 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  peVar3 = (this_02->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar4 = (peVar3->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (peVar3->m_merkle_tree).
           super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar14 = r->start;
  local_138 = &r->length;
  iVar13 = r->length;
  iVar12 = 0x18;
  pcVar17 = local_f8 + 1;
  do {
    pcVar16 = pcVar17;
    pcVar16[-1] = (char)(iVar13 + 9 >> ((byte)iVar12 & 0x1f));
    pcVar17 = pcVar16 + 1;
    iVar12 = iVar12 + -8;
  } while (iVar12 != -8);
  bVar19 = iVar14 == 0;
  bVar20 = pdVar4 != pdVar5;
  psVar6 = (this->super_peer_connection).super_peer_connection_hot_members.m_settings;
  local_d8 = (undefined1  [8])&psVar6->m_mutex;
  local_d0 = false;
  local_110 = r;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_d8);
  local_d0 = true;
  cVar15 = -6;
  if (!bVar20 || !bVar19) {
    cVar15 = '\a';
  }
  if (((psVar6->m_store).m_bools.super__Base_bitset<2UL>._M_w[0] >> 0x36 & 1) == 0) {
    cVar15 = '\a';
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
  ppVar8 = local_110;
  *pcVar16 = cVar15;
  iVar14 = (local_110->piece).m_val;
  iVar13 = 0x18;
  do {
    *pcVar17 = (char)(iVar14 >> ((byte)iVar13 & 0x1f));
    pcVar17 = pcVar17 + 1;
    iVar13 = iVar13 + -8;
  } while (iVar13 != -8);
  iVar14 = local_110->start;
  iVar13 = 0x18;
  do {
    *pcVar17 = (char)(iVar14 >> ((byte)iVar13 & 0x1f));
    pcVar17 = pcVar17 + 1;
    iVar13 = iVar13 + -8;
  } while (iVar13 != -8);
  if (bVar20 && bVar19) {
    local_158 = (char *)0x0;
    lStack_150 = 0;
    local_148 = 0;
    entry::entry((entry *)local_d8);
    this_00 = entry::list((entry *)local_d8);
    libtorrent::torrent_info::build_merkle_list
              ((map<int,_libtorrent::digest32<160L>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
                *)&local_a0,
               (this_02->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (piece_index_t)(ppVar8->piece).m_val);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (this_00,local_a0._M_impl.super__Rb_tree_header._M_node_count);
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_a0._M_impl.super__Rb_tree_header) {
      p_Var10 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_130._M_dataplus._M_p._0_4_ = 2;
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
        emplace_back<libtorrent::entry::data_type>(this_00,(data_type *)&local_130);
        pvVar9 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 entry::list((this_00->
                             super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1);
        std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::emplace_back<int_const&>
                  (pvVar9,(int *)(p_Var10 + 1));
        pvVar9 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                 entry::list((this_00->
                             super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                             )._M_impl.super__Vector_impl_data._M_finish + -1);
        local_108 = 0x14;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        local_130._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_130,(ulong)&local_108);
        local_130.field_2._M_allocated_capacity = local_108;
        *(undefined4 *)((long)local_130._M_dataplus._M_p + 0x10) =
             *(undefined4 *)((long)&p_Var10[1]._M_left + 4);
        pcVar16 = *(char **)((long)&p_Var10[1]._M_parent + 4);
        *(char **)local_130._M_dataplus._M_p = *(char **)&p_Var10[1].field_0x4;
        *(char **)((long)local_130._M_dataplus._M_p + 8) = pcVar16;
        local_130._M_string_length = local_108;
        *(undefined1 *)((long)local_130._M_dataplus._M_p + local_108) = 0;
        std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string>(pvVar9,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_a0._M_impl.super__Rb_tree_header);
    }
    local_130._M_dataplus._M_p = (pointer)&local_158;
    detail::bencode_recursive<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)&local_130,
               (entry *)local_d8);
    iVar14 = 0x18;
    do {
      *pcVar17 = (char)((int)lStack_150 - (int)local_158 >> ((byte)iVar14 & 0x1f));
      pcVar17 = pcVar17 + 1;
      iVar14 = iVar14 + -8;
    } while (iVar14 != -8);
    iVar14 = *local_138;
    pcVar17 = local_f8;
    iVar13 = 0x18;
    do {
      *pcVar17 = (char)(((int)lStack_150 - (int)local_158) + iVar14 + 0xd >> ((byte)iVar13 & 0x1f));
      pcVar17 = pcVar17 + 1;
      iVar13 = iVar13 + -8;
    } while (iVar13 != -8);
    buf_00.m_len = 0x11;
    buf_00.m_ptr = local_f8;
    peer_connection::send_buffer(&this->super_peer_connection,buf_00);
    buf_01.m_len = lStack_150 - (long)local_158;
    buf_01.m_ptr = local_158;
    peer_connection::send_buffer(&this->super_peer_connection,buf_01);
    std::
    _Rb_tree<int,_std::pair<const_int,_libtorrent::digest32<160L>_>,_std::_Select1st<std::pair<const_int,_libtorrent::digest32<160L>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_libtorrent::digest32<160L>_>_>_>
    ::~_Rb_tree(&local_a0);
    entry::~entry((entry *)local_d8);
    if (local_158 != (char *)0x0) {
      operator_delete(local_158,local_148 - (long)local_158);
    }
  }
  else {
    buf.m_len = 0xd;
    buf.m_ptr = local_f8;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
  }
  if ((local_100->m_ref).cookie == 0x7fffffff) {
    this_01 = &local_50;
    disk_buffer_holder::disk_buffer_holder(this_01,local_100);
    piVar18 = local_138;
    peer_connection::append_send_buffer<libtorrent::disk_buffer_holder>
              (&this->super_peer_connection,this_01,*local_138);
  }
  else {
    this_01 = &local_70;
    disk_buffer_holder::disk_buffer_holder(this_01,local_100);
    piVar18 = local_138;
    append_const_send_buffer<libtorrent::disk_buffer_holder>(this,this_01,*local_138);
  }
  disk_buffer_holder::~disk_buffer_holder(this_01);
  local_d8._0_4_ = (this->super_peer_connection).m_send_buffer.m_bytes - *piVar18;
  std::
  vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
  ::emplace_back<int,int_const&>
            ((vector<libtorrent::bt_peer_connection::range,std::allocator<libtorrent::bt_peer_connection::range>>
              *)&this->m_payloads,(int *)local_d8,piVar18);
  peer_connection::setup_send(&this->super_peer_connection);
  counters::inc_stats_counter((this->super_peer_connection).m_counters,0x5d,1);
  paVar11 = torrent::alerts(this_02);
  if (((paVar11->m_alert_mask)._M_i.m_val & 0x800080) != 0) {
    paVar11 = torrent::alerts(this_02);
    torrent::get_handle((torrent *)local_d8);
    iVar13 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x12])
                       (this);
    ppVar8 = local_110;
    iVar12 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0xd])
                       (this);
    iVar14 = (((this_02->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length;
    local_a0._M_impl._0_4_ = 0x4000;
    if (iVar14 < 0x4000) {
      local_a0._M_impl._0_4_ = iVar14;
    }
    if (iVar14 < 1) {
      local_a0._M_impl._0_4_ = 0x4000;
    }
    local_a0._M_impl._0_4_ = ppVar8->start / (int)local_a0._M_impl._0_4_;
    alert_manager::
    emplace_alert<libtorrent::block_uploaded_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,int,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
              (paVar11,(torrent_handle *)local_d8,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var,iVar13),
               (digest32<160L> *)CONCAT44(extraout_var_00,iVar12),(int *)&local_a0,&ppVar8->piece);
    plVar7 = (long *)CONCAT71(uStack_cf,local_d0);
    if (plVar7 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar18 = (int *)((long)plVar7 + 0xc);
        iVar14 = *piVar18;
        *piVar18 = *piVar18 + -1;
        UNLOCK();
      }
      else {
        iVar14 = *(int *)((long)plVar7 + 0xc);
        *(int *)((long)plVar7 + 0xc) = iVar14 + -1;
      }
      if (iVar14 == 1) {
        (**(code **)(*plVar7 + 0x18))();
      }
    }
  }
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  return;
}

Assistant:

void bt_peer_connection::write_piece(peer_request const& r, disk_buffer_holder buffer)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(m_sent_bitfield);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		bool merkle = t->torrent_file().is_merkle_torrent() && r.start == 0;
	// the hash piece looks like this:
	// uint8_t  msg
	// uint32_t piece index
	// uint32_t start
	// uint32_t list len
	// var      bencoded list
	// var      piece data
		char msg[4 + 1 + 4 + 4 + 4];
		char* ptr = msg;
		TORRENT_ASSERT(r.length <= 16 * 1024);
		detail::write_int32(r.length + 1 + 4 + 4, ptr);
		if (m_settings.get_bool(settings_pack::support_merkle_torrents) && merkle)
			detail::write_uint8(250, ptr);
		else
			detail::write_uint8(msg_piece, ptr);
		detail::write_int32(static_cast<int>(r.piece), ptr);
		detail::write_int32(r.start, ptr);

		// if this is a merkle torrent and the start offset
		// is 0, we need to include the merkle node hashes
		if (merkle)
		{
			std::vector<char> piece_list_buf;
			entry piece_list;
			entry::list_type& l = piece_list.list();
			std::map<int, sha1_hash> merkle_node_list = t->torrent_file().build_merkle_list(r.piece);
			l.reserve(merkle_node_list.size());
			for (auto const& i : merkle_node_list)
			{
				l.emplace_back(entry::list_t);
				l.back().list().emplace_back(i.first);
				l.back().list().emplace_back(i.second.to_string());
			}
			bencode(std::back_inserter(piece_list_buf), piece_list);
			detail::write_int32(int(piece_list_buf.size()), ptr);

			// back-patch the length field
			char* ptr2 = msg;
			detail::write_int32(r.length + 1 + 4 + 4 + 4 + int(piece_list_buf.size())
				, ptr2);

			send_buffer({msg, 17});
			send_buffer(piece_list_buf);
		}
		else
		{
			send_buffer({msg, 13});
		}

		if (buffer.is_mutable())
		{
			append_send_buffer(std::move(buffer), r.length);
		}
		else
		{
			append_const_send_buffer(std::move(buffer), r.length);
		}

		m_payloads.emplace_back(send_buffer_size() - r.length, r.length);
		setup_send();

		stats_counters().inc_stats_counter(counters::num_outgoing_piece);

		if (t->alerts().should_post<block_uploaded_alert>())
		{
			t->alerts().emplace_alert<block_uploaded_alert>(t->get_handle(),
				remote(), pid(), r.start / t->block_size() , r.piece);
		}
	}